

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

int __thiscall
ON_TextureMapping::EvaluateSphereMapping
          (ON_TextureMapping *this,ON_3dPoint *P,ON_3dVector *N,ON_3dPoint *T)

{
  double __y;
  int iVar1;
  double __x;
  double local_e8;
  double local_e0;
  ON_3dPoint local_d0;
  double local_b8;
  double latitude;
  double longitude;
  ON_3dPoint local_90;
  int local_74;
  undefined1 auStack_70 [4];
  int rc;
  ON_3dVector n;
  double t1;
  double t0;
  double r;
  ON_3dPoint rst;
  ON_3dPoint *T_local;
  ON_3dVector *N_local;
  ON_3dPoint *P_local;
  ON_TextureMapping *this_local;
  
  rst.z = (double)T;
  ON_Xform::operator*((ON_3dPoint *)&r,&this->m_Pxyz,P);
  t0 = ON_3dVector::Length((ON_3dVector *)&r);
  if (this->m_projection == ray_projection) {
    ON_Xform::operator*((ON_3dVector *)auStack_70,&this->m_Nxyz,N);
    local_74 = ON_SolveQuadraticEquation
                         (n.y * n.y + _auStack_70 * _auStack_70 + n.x * n.x,
                          (rst.y * n.y + r * _auStack_70 + rst.x * n.x) * 2.0,
                          (rst.y * rst.y + r * r + rst.x * rst.x) - 1.0,&t1,&n.z);
    if (-1 < local_74) {
      if ((local_74 != 2) && (iVar1 = BestHitHelper(t1,n.z), iVar1 == 1)) {
        t1 = n.z;
      }
      ::operator*((ON_3dVector *)&longitude,t1,(ON_3dVector *)auStack_70);
      ON_3dPoint::operator+(&local_90,(ON_3dPoint *)&r,(ON_3dVector *)&longitude);
      r = local_90.x;
      rst.x = local_90.y;
      rst.y = local_90.z;
    }
  }
  if ((((rst.x != 0.0) || (NAN(rst.x))) || (r != 0.0)) || (NAN(r))) {
    local_e0 = atan2(rst.x,r);
  }
  else {
    local_e0 = 0.0;
  }
  __y = rst.y;
  latitude = local_e0;
  if ((rst.y != 0.0) || (NAN(rst.y))) {
    __x = ON_2dVector::Length((ON_2dVector *)&r);
    local_e8 = atan2(__y,__x);
  }
  else {
    local_e8 = 0.0;
  }
  local_b8 = local_e8;
  if (3.141592653589793 < local_e8) {
    local_b8 = local_e8 - 6.283185307179586;
  }
  r = (latitude * 0.5) / 3.141592653589793;
  if (-2.220446049250313e-16 <= r) {
    if (0.0 <= r) {
      if (1.0 < r) {
        r = 1.0;
      }
    }
    else {
      r = 0.0;
    }
  }
  else {
    r = r + 1.0;
  }
  rst.x = local_b8 / 3.141592653589793 + 0.5;
  if (0.0 < rst.x) {
    if (1.0 < rst.x) {
      rst.x = 1.0;
    }
  }
  else {
    rst.x = 0.0;
  }
  rst.y = t0;
  ON_Xform::operator*(&local_d0,&this->m_uvw,(ON_3dPoint *)&r);
  *(double *)rst.z = local_d0.x;
  *(double *)((long)rst.z + 8) = local_d0.y;
  *(double *)((long)rst.z + 0x10) = local_d0.z;
  return 1;
}

Assistant:

int ON_TextureMapping::EvaluateSphereMapping(
											  const ON_3dPoint& P,
											  const ON_3dVector& N,
											  ON_3dPoint* T
											  ) const
{
  // The matrix m_Pxyz transforms the world coordinate
  // "mapping sphere" into the sphere centered at
  // rst = (0,0,0) with radius 1.0.

  ON_3dPoint rst(m_Pxyz*P);
	const double r = ((const ON_3dVector*)(&rst.x))->Length();
	double t0, t1;

	if ( ON_TextureMapping::PROJECTION::ray_projection == m_projection )
	{
		ON_3dVector n(m_Nxyz*N);
		// Shoot a ray from P in the direction N and see if it
		// hits the sphere.
		int rc = ON_SolveQuadraticEquation( (n.x*n.x+n.y*n.y+n.z*n.z),
			2.0*(rst.x*n.x+rst.y*n.y+rst.z*n.z),
			(rst.x*rst.x+rst.y*rst.y+rst.z*rst.z) - 1.0,
			&t0, &t1 );
		if (rc >= 0 )
		{
			if ( 2 != rc && 1 == BestHitHelper(t0,t1) )
			{
				t0 = t1;
			}
			rst = rst + t0*n;
		}
	}

	// convert sphere 3d location to longitude, latitude, radius
	double longitude = (0.0 != rst.y || 0.0 != rst.x)
		? atan2(rst.y,rst.x)
		: 0.0;
	double latitude = (0.0 != rst.z)
		? atan2(rst.z,((const ON_2dVector*)(&rst.x))->Length())
		: 0.0;
	if ( latitude > ON_PI )
		latitude -= 2.0*ON_PI;

  // convert longitude to normalized texture coordinate
	rst.x = 0.5*longitude/ON_PI;
	if ( rst.x < -ON_EPSILON )
		rst.x += 1.0;
	else if (rst.x < 0.0)
		rst.x = 0.0;
	else if (rst.x > 1.0)
		rst.x = 1.0;

  // convert longitude to normalized texture coordinate
	rst.y = latitude/ON_PI + 0.5;
  if ( rst.y <= 0.0 )
    rst.y = 0.0;
	else if ( rst.y > 1.0 )
		  rst.y = 1.0;

  // radius is already normalized
	rst.z = r;

  // apply texture coordinate transformation
	*T = m_uvw*rst;

  return 1;
}